

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

void * __thiscall QVariant::prepareForEmplace(QVariant *this,QMetaType type)

{
  ushort uVar1;
  bool bVar2;
  PrivateShared *pPVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  QMetaTypeInterface *newIface;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = Private::canUseInternalSpace(type.d_ptr);
  if (bVar2) {
    clear(this);
    *(ulong *)&(this->d).field_0x18 =
         (ulong)((uint)*(undefined8 *)&(this->d).field_0x18 & 3) |
         (ulong)type.d_ptr & 0xfffffffffffffffc;
  }
  else {
    uVar6 = *(ulong *)&(this->d).field_0x18;
    if (((uVar6 & 1) != 0) &&
       (pPVar3 = (this->d).data.shared,
       (__int_type_conflict)
       (pPVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int> == 1)) {
      uVar6 = uVar6 & 0xfffffffffffffffc;
      uVar1 = (type.d_ptr)->alignment;
      uVar5 = (uint)uVar1;
      if (uVar1 < 9) {
        uVar5 = 8;
      }
      uVar4 = 8;
      if (8 < *(ushort *)(uVar6 + 2)) {
        uVar4 = (uint)*(ushort *)(uVar6 + 2);
      }
      if ((ulong)uVar5 + (ulong)(type.d_ptr)->size <= (ulong)uVar4 + (ulong)*(uint *)(uVar6 + 4)) {
        if (*(code **)(uVar6 + 0x38) != (code *)0x0) {
          (**(code **)(uVar6 + 0x38))
                    (uVar6,(long)&(pPVar3->ref).super_QAtomicInteger<int>.
                                  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> +
                           (long)pPVar3->offset);
          pPVar3 = (this->d).data.shared;
          uVar1 = (type.d_ptr)->alignment;
        }
        pPVar3->offset = (-(uint)uVar1 & (int)pPVar3 + (uint)uVar1 + 7) - (int)pPVar3;
        *(ulong *)&(this->d).field_0x18 =
             (ulong)((uint)*(undefined8 *)&(this->d).field_0x18 & 3) |
             (ulong)type.d_ptr & 0xfffffffffffffffc;
        this = (QVariant *)
               ((long)&(pPVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                       _q_value.super___atomic_base<int> + (long)pPVar3->offset);
        goto LAB_002a3363;
      }
    }
    local_48._16_4_ = 0xaaaaaaaa;
    local_48._20_4_ = 0xaaaaaaaa;
    uStack_30 = 0xaaaaaaaa;
    uStack_2c = 0xaaaaaaaa;
    local_48._0_4_ = 0xaaaaaaaa;
    local_48._4_4_ = 0xaaaaaaaa;
    local_48._8_4_ = 0xaaaaaaaa;
    local_48._12_4_ = 0xaaaaaaaa;
    QVariant((QVariant *)&local_48,type.d_ptr);
    std::swap<QVariant::Private>(&this->d,(Private *)&local_48);
    if (((this->d).field_0x18 & 1) != 0) {
      pPVar3 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar3->offset);
    }
    ~QVariant((QVariant *)&local_48);
  }
LAB_002a3363:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

void *QVariant::prepareForEmplace(QMetaType type)
{
    /* There are two cases where we can reuse the existing storage
       (1) The new type fits in QVariant's SBO storage
       (2) We are using the externally allocated storage, the variant is
           detached, and the new type fits into the existing storage.
       In all other cases (3), we cannot reuse the storage.
     */
    auto typeFits = [&] {
        auto newIface = type.iface();
        auto oldIface = d.typeInterface();
        auto newSize = PrivateShared::computeAllocationSize(newIface->size, newIface->alignment);
        auto oldSize = PrivateShared::computeAllocationSize(oldIface->size, oldIface->alignment);
        return newSize <= oldSize;
    };
    if (Private::canUseInternalSpace(type.iface())) { // (1)
        clear();
        d.packedType = quintptr(type.iface()) >> 2;
        return d.data.data;
    } else if (d.is_shared && isDetached() && typeFits()) { // (2)
        QtMetaTypePrivate::destruct(d.typeInterface(), d.data.shared->data());
        // compare QVariant::PrivateShared::create
        const auto ps = d.data.shared;
        const auto align = type.alignOf();
        ps->offset =  PrivateShared::computeOffset(ps, align);
        d.packedType = quintptr(type.iface()) >> 2;
        return ps->data();
    }
    // (3)
    QVariant newVariant(std::in_place, type);
    swap(newVariant);
    // const cast is safe, we're in a non-const method
    return const_cast<void *>(d.storage());
}